

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

InterfaceHandle __thiscall
helics::CommonCore::getPublication(CommonCore *this,LocalFederateId federateID,string_view key)

{
  bool bVar1;
  BasicHandleInfo *this_00;
  LocalFederateId in_ESI;
  ordered_guarded<helics::HandleManager,_std::shared_mutex> *unaff_retaddr;
  _Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
  *pub;
  InterfaceHandle in_stack_fffffffffffffffc;
  
  this_00 = (BasicHandleInfo *)
            gmlc::libguarded::ordered_guarded<helics::HandleManager,std::shared_mutex>::
            read<helics::CommonCore::getPublication(helics::LocalFederateId,std::basic_string_view<char,std::char_traits<char>>)const::__0>
                      (unaff_retaddr,
                       (anon_class_8_1_ba1d59bf *)CONCAT44(in_stack_fffffffffffffffc.hid,in_ESI.fid)
                      );
  bVar1 = LocalFederateId::operator!=(&this_00->local_fed_id,in_ESI);
  if (bVar1) {
    memset(&stack0xfffffffffffffffc,0,4);
    InterfaceHandle::InterfaceHandle((InterfaceHandle *)&stack0xfffffffffffffffc);
  }
  else {
    in_stack_fffffffffffffffc = BasicHandleInfo::getInterfaceHandle(this_00);
  }
  return (InterfaceHandle)in_stack_fffffffffffffffc.hid;
}

Assistant:

InterfaceHandle CommonCore::getPublication(LocalFederateId federateID, std::string_view key) const
{
    const auto* pub = handles.read(
        [&key](auto& hand) { return hand.getInterfaceHandle(key, InterfaceType::PUBLICATION); });
    if (pub->local_fed_id != federateID) {
        return {};
    }
    return pub->getInterfaceHandle();
}